

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::getMessageTarget
          (RpcConnectionState *this,Reader *target)

{
  Reader ops_00;
  CapTableReader *pCVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  CapTableReader *pCVar7;
  mapped_type *pmVar8;
  short sVar9;
  Reader *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *pCVar10;
  ClientHook *extraout_RDX_04;
  ClientHook *extraout_RDX_05;
  ulong uVar11;
  SegmentReader *pSVar12;
  Maybe<kj::Own<capnp::ClientHook>_> MVar13;
  NullableValue<kj::Array<capnp::PipelineOp>_> ops;
  Reader promisedAnswer;
  Fault f;
  capnp local_238;
  undefined7 uStack_237;
  CapTableReader *local_230;
  undefined8 uStack_228;
  undefined8 *puStack_220;
  String local_218;
  capnp local_1f8;
  CapTableReader *local_1f0;
  undefined8 uStack_1e8;
  undefined8 *puStack_1e0;
  StructReader local_1d8;
  ListReader local_1a8;
  Exception local_178;
  ulong uVar6;
  
  uVar5 = (in_RDX->_reader).dataSize;
  if (uVar5 < 0x30) {
    sVar9 = 0;
  }
  else {
    sVar9 = *(short *)((long)(in_RDX->_reader).data + 4);
  }
  if (sVar9 == 1) {
    uVar5 = 0;
    if ((in_RDX->_reader).pointerCount == 0) {
      local_178.file._0_4_ = 0x7fffffff;
      pCVar7 = (CapTableReader *)0x0;
      local_178.ownFile.content.disposer = (ArrayDisposer *)0x0;
      local_178.ownFile.content.ptr = (char *)0x0;
    }
    else {
      local_178.ownFile.content.ptr = (char *)(in_RDX->_reader).segment;
      pCVar7 = (in_RDX->_reader).capTable;
      local_178.ownFile.content.disposer = (ArrayDisposer *)(in_RDX->_reader).pointers;
      local_178.file._0_4_ = (in_RDX->_reader).nestingLimit;
    }
    local_178.ownFile.content.size_ = (size_t)pCVar7;
    PointerReader::getStruct(&local_1d8,(PointerReader *)&local_178,(word *)0x0);
    if (0x1f < local_1d8.dataSize) {
      uVar5 = *local_1d8.data;
    }
    local_178.ownFile.content.ptr = (char *)CONCAT44(local_178.ownFile.content.ptr._4_4_,uVar5);
    if (uVar5 < 0x10) {
      pmVar8 = (mapped_type *)((long)target + (ulong)uVar5 * 0x50 + 0x238);
    }
    else {
      pmVar8 = std::
               unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
               ::operator[]((unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                             *)&target[0x26]._reader.pointers,(key_type *)&local_178);
    }
    if (pmVar8->active == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
                ((Fault *)&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x992,FAILED,"base.active",
                 "\"PromisedAnswer.questionId is not a current question.\"",
                 (char (*) [53])"PromisedAnswer.questionId is not a current question.");
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      kj::_::Debug::Fault::~Fault((Fault *)&local_178);
      pSVar12 = (SegmentReader *)0x0;
      pCVar7 = (CapTableReader *)0x0;
      pCVar10 = extraout_RDX_05;
    }
    else {
      if ((pmVar8->pipeline).ptr.ptr == (PipelineHook *)0x0) {
        kj::_::Debug::makeDescription<char_const(&)[80]>
                  (&local_218,
                   (Debug *)
                   "\"Pipeline call on a request that returned no capabilities or was already closed.\""
                   ,
                   "Pipeline call on a request that returned no capabilities or was already closed."
                   ,(char (*) [80])pCVar7);
        kj::Exception::Exception
                  (&local_178,FAILED,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x999,&local_218);
        newBrokenPipeline(&local_238,&local_178);
        pCVar7 = local_230;
        pSVar12 = (SegmentReader *)CONCAT71(uStack_237,local_238);
        local_230 = (CapTableReader *)0x0;
        kj::Exception::~Exception(&local_178);
        sVar4 = local_218.content.size_;
        pcVar3 = local_218.content.ptr;
        if (local_218.content.ptr != (char *)0x0) {
          local_218.content.ptr = (char *)0x0;
          local_218.content.size_ = 0;
          (**(local_218.content.disposer)->_vptr_ArrayDisposer)
                    (local_218.content.disposer,pcVar3,1,sVar4,sVar4,0);
        }
      }
      else {
        (**((pmVar8->pipeline).ptr.ptr)->_vptr_PipelineHook)();
        pSVar12 = (SegmentReader *)local_178.ownFile.content.ptr;
        pCVar7 = (CapTableReader *)local_178.ownFile.content.size_;
      }
      if (local_1d8.pointerCount == 0) {
        local_1d8.nestingLimit = 0x7fffffff;
        local_1d8.capTable = (CapTableReader *)0x0;
        local_1d8.pointers = (WirePointer *)0x0;
        local_1d8.segment = (SegmentReader *)0x0;
      }
      local_178.ownFile.content.ptr = (char *)local_1d8.segment;
      local_178.ownFile.content.size_ = (size_t)local_1d8.capTable;
      local_178.ownFile.content.disposer = (ArrayDisposer *)local_1d8.pointers;
      local_178.file._0_4_ = local_1d8.nestingLimit;
      PointerReader::getList(&local_1a8,(PointerReader *)&local_178,INLINE_COMPOSITE,(word *)0x0);
      ops_00.reader.capTable = local_1a8.capTable;
      ops_00.reader.segment = local_1a8.segment;
      ops_00.reader.ptr = local_1a8.ptr;
      ops_00.reader.elementCount = local_1a8.elementCount;
      ops_00.reader.step = local_1a8.step;
      ops_00.reader.structDataSize = local_1a8.structDataSize;
      ops_00.reader.structPointerCount = local_1a8.structPointerCount;
      ops_00.reader.elementSize = local_1a8.elementSize;
      ops_00.reader._39_1_ = local_1a8._39_1_;
      ops_00.reader.nestingLimit = local_1a8.nestingLimit;
      ops_00.reader._44_4_ = local_1a8._44_4_;
      toPipelineOps(ops_00);
      uVar2 = uStack_1e8;
      pCVar1 = local_1f0;
      local_238 = local_1f8;
      if (local_1f8 == (capnp)0x1) {
        local_230 = local_1f0;
        uStack_228 = uStack_1e8;
        puStack_220 = puStack_1e0;
        local_1f0 = (CapTableReader *)0x0;
        uStack_1e8 = 0;
        (*pCVar7->_vptr_CapTableReader[1])(&local_178,pCVar7,pCVar1,uVar2);
        (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_178.ownFile.content.ptr;
        (this->super_Refcounted).super_Disposer._vptr_Disposer =
             (_func_int **)local_178.ownFile.content.size_;
        pCVar10 = extraout_RDX_02;
      }
      else {
        (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        pCVar10 = extraout_RDX_01;
      }
      uVar2 = uStack_228;
      pCVar1 = local_230;
      if ((local_238 == (capnp)0x1) && (local_230 != (CapTableReader *)0x0)) {
        local_230 = (CapTableReader *)0x0;
        uStack_228 = 0;
        (**(code **)*puStack_220)(puStack_220,pCVar1,8,uVar2,uVar2,0);
        pCVar10 = extraout_RDX_03;
      }
    }
    if (pCVar7 != (CapTableReader *)0x0) {
      (*(code *)pSVar12->arena->_vptr_Arena)
                (pSVar12,pCVar7->_vptr_CapTableReader[-2] + (long)&pCVar7->_vptr_CapTableReader);
      pCVar10 = extraout_RDX_04;
    }
  }
  else {
    if (sVar9 == 0) {
      if (uVar5 < 0x20) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(in_RDX->_reader).data;
      }
      uVar6 = (ulong)uVar5;
      pCVar7 = target[9]._reader.capTable;
      uVar11 = ((long)target[9]._reader.data - (long)pCVar7 >> 3) * -0x3333333333333333;
      if ((uVar11 < uVar6 || uVar11 - uVar6 == 0) ||
         (*(int *)&pCVar7[uVar6 * 5]._vptr_CapTableReader == 0)) {
        pCVar7 = (CapTableReader *)0x0;
      }
      else {
        pCVar7 = pCVar7 + uVar6 * 5;
      }
      if (pCVar7 != (CapTableReader *)0x0) {
        (**(code **)(*pCVar7[2]._vptr_CapTableReader + 0x20))(&local_178);
        (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_178.ownFile.content.ptr;
        (this->super_Refcounted).super_Disposer._vptr_Disposer =
             (_func_int **)local_178.ownFile.content.size_;
        pCVar10 = extraout_RDX;
        goto LAB_003c69fa;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                ((Fault *)&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x986,FAILED,(char *)0x0,"\"Message target is not a current export ID.\"",
                 (char (*) [43])"Message target is not a current export ID.");
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader_const&>
                ((Fault *)&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x9a5,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
                 (char (*) [29])"Unknown message target type.",in_RDX);
    }
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)&local_178);
    pCVar10 = extraout_RDX_00;
  }
LAB_003c69fa:
  MVar13.ptr.ptr = pCVar10;
  MVar13.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar13.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> getMessageTarget(const rpc::MessageTarget::Reader& target) {
    switch (target.which()) {
      case rpc::MessageTarget::IMPORTED_CAP: {
        KJ_IF_MAYBE(exp, exports.find(target.getImportedCap())) {
          return exp->clientHook->addRef();
        } else {
          KJ_FAIL_REQUIRE("Message target is not a current export ID.") {
            return nullptr;
          }
        }
        break;
      }